

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTrajectory.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkTrajectory::Initialize
          (ChLinkTrajectory *this,shared_ptr<chrono::ChBody> *mbody1,
          shared_ptr<chrono::ChBody> *mbody2,ChVector<double> *mpos1,
          shared_ptr<chrono::geometry::ChLine> *mline)

{
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> _Stack_d8;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2> local_b8;
  undefined1 local_a8 [16];
  double local_98;
  double local_90;
  undefined1 local_88 [16];
  double local_78;
  undefined1 local_68 [48];
  double local_38;
  
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c8,&mbody1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_d8,&mbody2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  local_68._0_8_ = mpos1->m_data[0];
  local_68._8_8_ = mpos1->m_data[1];
  local_68._16_8_ = mpos1->m_data[2];
  local_98 = 0.0;
  local_a8 = ZEXT816(0) << 0x20;
  local_68._24_8_ = 1.0;
  local_38 = 0.0;
  local_90 = 1.0;
  local_78 = 0.0;
  local_88 = local_a8;
  local_68._32_16_ = local_a8;
  ChLinkMarkers::Initialize
            ((ChLinkMarkers *)this,(shared_ptr<chrono::ChBody> *)&local_c8,
             (shared_ptr<chrono::ChBody> *)&_Stack_d8,true,(ChCoordsys<double> *)local_68,
             (ChCoordsys<double> *)local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  std::__shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b8,
             &mline->super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->trajectory_line).
              super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  return;
}

Assistant:

void ChLinkTrajectory::Initialize(std::shared_ptr<ChBody> mbody1,
                                  std::shared_ptr<ChBody> mbody2,
                                  const ChVector<>& mpos1,
                                  std::shared_ptr<geometry::ChLine> mline) {
    ChLinkMarkers::Initialize(mbody1, mbody2, true, ChCoordsys<>(mpos1), ChCoordsys<>());
    this->Set_trajectory_line(mline);
}